

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_NAMESPACE::Load
          (_Type_NAMESPACE *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  long *plVar1;
  Namespace *this_00;
  Memory *this_01;
  _Alloc_hider name;
  char cVar2;
  uint uVar3;
  uint id;
  code *pcVar4;
  long in_R8;
  uint uVar5;
  string key;
  Nullable<LiteScript::Variable> local_50;
  
  Object::Reassign(object,(Type *)_type_namespace,0x20);
  this_00 = (Namespace *)object->data;
  uVar3 = IStreamer::Read<unsigned_int>(stream);
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    if (uVar5 == uVar3) {
      std::__cxx11::string::~string((string *)&key);
      return;
    }
    key._M_string_length = 0;
    *key._M_dataplus._M_p = '\0';
    while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
      cVar2 = std::istream::get();
      if (cVar2 == '\0') break;
      std::__cxx11::string::push_back((char)&key);
    }
    name._M_p = key._M_dataplus._M_p;
    this_01 = object->memory;
    plVar1 = (long *)((long)(this_01->arr)._M_elems + in_R8);
    pcVar4 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar4 = *(code **)(*plVar1 + -1 + caller);
    }
    id = (*pcVar4)(plVar1,stream);
    Memory::GetVariable(&local_50,this_01,id);
    Namespace::DefineVariable(this_00,name._M_p,(Variable *)&local_50);
    Nullable<LiteScript::Variable>::Nullify(&local_50);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void LiteScript::_Type_NAMESPACE::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::NAMESPACE, sizeof(Namespace));
    Namespace& obj = object.GetData<Namespace>();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string key;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        key.clear();
        while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
            key += c;
        obj.DefineVariable(key.c_str(), *object.memory.GetVariable((object.memory.*caller)(stream)));
    }
}